

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::enterFunction(Builder *this,Function *function)

{
  LinkageType linkType;
  Id IVar1;
  mapped_type_conflict *pmVar2;
  _Head_base<0UL,_spv::Instruction_*,_false> this_00;
  Id IVar3;
  Id funcId;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  
  this->restoreNonSemanticShaderDebugInfo = this->emitNonSemanticShaderDebugInfo;
  if ((this->sourceLang == SourceLanguageHLSL) && (this->entryPointFunction == function)) {
    this->emitNonSemanticShaderDebugInfo = false;
  }
  else if (this->emitNonSemanticShaderDebugInfo != false) {
    funcId = (function->functionInstruction).resultId;
    pmVar2 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&funcId);
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&(this->currentDebugScopeId).c,pmVar2);
    IVar3 = this->uniqueId + 1;
    this->uniqueId = IVar3;
    this_00._M_head_impl = (Instruction *)::operator_new(0x60);
    IVar1 = makeVoidType(this);
    (this_00._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_0089f058;
    (this_00._M_head_impl)->resultId = IVar3;
    (this_00._M_head_impl)->typeId = IVar1;
    (this_00._M_head_impl)->opCode = OpExtInst;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    ((this_00._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    ((this_00._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    ((this_00._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    (this_00._M_head_impl)->block = (Block *)0x0;
    Instruction::reserveOperands(this_00._M_head_impl,4);
    Instruction::addIdOperand(this_00._M_head_impl,this->nonSemanticShaderDebugInfo);
    Instruction::addImmediateOperand(this_00._M_head_impl,0x65);
    pmVar2 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&funcId);
    Instruction::addIdOperand(this_00._M_head_impl,*pmVar2);
    Instruction::addIdOperand(this_00._M_head_impl,funcId);
    local_38._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
         (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
         this_00._M_head_impl;
    addInstruction(this,&local_38);
    if (local_38._M_t.
        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
  }
  linkType = function->linkType;
  if (linkType != LinkageTypeMax) {
    IVar1 = (function->functionInstruction).resultId;
    addCapability(this,CapabilityLinkage);
    addLinkageDecoration(this,IVar1,(function->exportName)._M_dataplus._M_p,linkType);
  }
  return;
}

Assistant:

void Builder::enterFunction(Function const* function)
{
    // Save and disable debugInfo for HLSL entry point function. It is a wrapper
    // function with no user code in it.
    restoreNonSemanticShaderDebugInfo = emitNonSemanticShaderDebugInfo;
    if (sourceLang == spv::SourceLanguageHLSL && function == entryPointFunction) {
        emitNonSemanticShaderDebugInfo = false;
    }

    if (emitNonSemanticShaderDebugInfo) {
        // Initialize scope state
        Id funcId = function->getFuncId();
        currentDebugScopeId.push(debugId[funcId]);
        // Create DebugFunctionDefinition
        spv::Id resultId = getUniqueId();
        Instruction* defInst = new Instruction(resultId, makeVoidType(), OpExtInst);
        defInst->reserveOperands(4);
        defInst->addIdOperand(nonSemanticShaderDebugInfo);
        defInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugFunctionDefinition);
        defInst->addIdOperand(debugId[funcId]);
        defInst->addIdOperand(funcId);
        addInstruction(std::unique_ptr<Instruction>(defInst));
    }

    if (auto linkType = function->getLinkType(); linkType != LinkageTypeMax) {
        Id funcId = function->getFuncId();
        addCapability(CapabilityLinkage);
        addLinkageDecoration(funcId, function->getExportName(), linkType);
    }
}